

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FastEntityStatePdu.cpp
# Opt level: O2

void __thiscall DIS::FastEntityStatePdu::~FastEntityStatePdu(FastEntityStatePdu *this)

{
  (this->super_EntityInformationFamilyPdu).super_Pdu.super_PduSuperclass._vptr_PduSuperclass =
       (_func_int **)&PTR__FastEntityStatePdu_001c1bc8;
  std::vector<DIS::VariableParameter,_std::allocator<DIS::VariableParameter>_>::clear
            (&this->_variableParameters);
  std::vector<DIS::VariableParameter,_std::allocator<DIS::VariableParameter>_>::~vector
            (&this->_variableParameters);
  EntityInformationFamilyPdu::~EntityInformationFamilyPdu(&this->super_EntityInformationFamilyPdu);
  return;
}

Assistant:

FastEntityStatePdu::~FastEntityStatePdu()
{
    _variableParameters.clear();
}